

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_BezierCage *src)

{
  bool bVar1;
  double *Point;
  int i;
  int i_00;
  int j;
  int k;
  
  bVar1 = Create(this,src->m_dim,src->m_is_rat,src->m_order[0],src->m_order[1],src->m_order[2],
                 src->m_order[0],src->m_order[1],src->m_order[2]);
  if (bVar1) {
    for (i_00 = 0; i_00 < this->m_cv_count[0]; i_00 = i_00 + 1) {
      for (j = 0; j < this->m_cv_count[1]; j = j + 1) {
        for (k = 0; k < this->m_cv_count[2]; k = k + 1) {
          Point = ON_BezierCage::CV(src,i_00,j,k);
          SetCV(this,i_00,j,k,intrinsic_point_style,Point);
        }
      }
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=( const ON_BezierCage& src )
{
  if ( Create(src.m_dim,src.m_is_rat,
              src.m_order[0],src.m_order[1],src.m_order[2],
              src.m_order[0],src.m_order[1],src.m_order[2]) )
  {
    int i,j,k;
    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          SetCV(i,j,k,ON::intrinsic_point_style,src.CV(i,j,k));
        }           
      }
    }
  }
  return *this;
}